

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QCss::Pseudo>::end(QList<QCss::Pseudo> *this)

{
  Pseudo *n;
  QArrayDataPointer<QCss::Pseudo> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QCss::Pseudo> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QCss::Pseudo> *)0x48c839);
  QArrayDataPointer<QCss::Pseudo>::operator->(in_RDI);
  n = QArrayDataPointer<QCss::Pseudo>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }